

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O0

LTFlightData * __thiscall ACTable::build(ACTable *this,string *_filter,int _x,int _y)

{
  bool bVar1;
  size_type sVar2;
  FDStaticData *pFVar3;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  float _x_00;
  ImVec2 IVar4;
  string *in_stack_00000008;
  string *in_stack_00000010;
  string url;
  ImGuiContext *pCtxt;
  ACIWnd *pACIWnd;
  bool bAutoVisible;
  bool bVisible;
  LTAircraft *pAc;
  LTFlightData *pFD;
  ImVec2 selSize;
  ImU32 colHeader;
  size_t col_1;
  FDInfo *fdi;
  iterator __end2;
  iterator __begin2;
  vector<FDInfo,_std::allocator<FDInfo>_> *__range2;
  ImGuiTableSortSpecsColumn *colSpec;
  ImGuiTableSortSpecs *sortSpecs;
  bool bUpdated;
  ACTColDefTy *colDef;
  ImGuiID col;
  ImVec2 tblSize;
  LTFlightData *pSelFD;
  string *in_stack_00000450;
  ACTable *in_stack_00000458;
  undefined4 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfc;
  undefined1 in_stack_fffffffffffffdfd;
  undefined1 in_stack_fffffffffffffdfe;
  undefined1 in_stack_fffffffffffffdff;
  DataRefs *in_stack_fffffffffffffe00;
  ImGuiTableFlags in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  FDInfo *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  string *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  ImU32 in_stack_fffffffffffffe30;
  undefined2 in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  allocator<char> *in_stack_fffffffffffffe38;
  ACTable *in_stack_fffffffffffffe40;
  LTAircraft *local_1b8;
  undefined1 local_191 [39];
  byte local_16a;
  undefined1 local_169 [33];
  string local_148 [40];
  ACIWnd *local_120;
  undefined1 local_113;
  byte local_112;
  allocator<char> local_111;
  string local_110 [32];
  string local_f0 [55];
  undefined1 local_b9 [33];
  LTAircraft *local_98;
  LTFlightData *local_90;
  ImVec2 local_84;
  undefined4 local_7c;
  ulong local_78;
  reference local_70;
  undefined8 local_68;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_> local_60;
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  _Alloc_hider local_39;
  reference local_38;
  uint local_2c;
  float local_28;
  float fStack_24;
  LTFlightData *local_20;
  int local_18;
  int local_14;
  
  local_20 = (LTFlightData *)0x0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  IVar4 = ImGui::GetContentRegionAvail();
  fStack_24 = IVar4.y;
  if (local_14 < 1) {
    local_28 = IVar4.x;
    local_28 = (float)local_14 + local_28;
  }
  else {
    local_28 = (float)local_14;
  }
  if (local_18 < 1) {
    fStack_24 = (float)local_18 + fStack_24;
  }
  else {
    fStack_24 = (float)local_18;
  }
  bVar1 = ImGui::BeginTable((char *)in_stack_fffffffffffffe10,
                            CONCAT13(in_stack_fffffffffffffe0f,
                                     CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)),
                            in_stack_fffffffffffffe08,(ImVec2 *)in_stack_fffffffffffffe00,
                            (float)CONCAT13(in_stack_fffffffffffffdff,
                                            CONCAT12(in_stack_fffffffffffffdfe,
                                                     CONCAT11(in_stack_fffffffffffffdfd,
                                                              in_stack_fffffffffffffdfc))));
  if (bVar1) {
    for (local_2c = 0; local_2c < 0x27; local_2c = local_2c + 1) {
      local_38 = std::array<ACTColDefTy,_39UL>::operator[]
                           ((array<ACTColDefTy,_39UL> *)in_stack_fffffffffffffe00,
                            CONCAT17(in_stack_fffffffffffffdff,
                                     CONCAT16(in_stack_fffffffffffffdfe,
                                              CONCAT15(in_stack_fffffffffffffdfd,
                                                       CONCAT14(in_stack_fffffffffffffdfc,
                                                                in_stack_fffffffffffffdf8)))));
      std::__cxx11::string::c_str();
      ImGui::TableSetupColumn
                ((char *)CONCAT17(in_stack_fffffffffffffe37,
                                  CONCAT16(in_stack_fffffffffffffe36,
                                           CONCAT24(in_stack_fffffffffffffe34,
                                                    in_stack_fffffffffffffe30))),
                 (ImGuiTableColumnFlags)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                 (float)in_stack_fffffffffffffe28,
                 (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    }
    ImGui::TableAutoHeaders();
    local_39 = (_Alloc_hider)UpdateFDIs(in_stack_00000458,in_stack_00000450);
    local_48 = ImGui::TableGetSortSpecs();
    if ((((byte)local_39 & 1) != 0) ||
       (((((ImGuiTableSortSpecs *)local_48 != (ImGuiTableSortSpecs *)0x0 &&
          ((((ImGuiTableSortSpecs *)local_48)->SpecsChanged & 1U) != 0)) &&
         (((ImGuiTableSortSpecs *)local_48)->Specs != (ImGuiTableSortSpecsColumn *)0x0)) &&
        ((0 < ((ImGuiTableSortSpecs *)local_48)->SpecsCount &&
         (sVar2 = std::vector<FDInfo,_std::allocator<FDInfo>_>::size
                            ((vector<FDInfo,_std::allocator<FDInfo>_> *)(in_RDI + 8)), 1 < sVar2))))
       )) {
      local_50 = *(undefined8 *)local_48;
      Sort(in_stack_fffffffffffffe40,(ACTColumnsTy)((ulong)in_stack_fffffffffffffe38 >> 0x20),
           SUB81((ulong)in_stack_fffffffffffffe38 >> 0x18,0));
    }
    local_58 = in_RDI + 8;
    local_60._M_current =
         (FDInfo *)
         std::vector<FDInfo,_std::allocator<FDInfo>_>::begin
                   ((vector<FDInfo,_std::allocator<FDInfo>_> *)
                    CONCAT17(in_stack_fffffffffffffdff,
                             CONCAT16(in_stack_fffffffffffffdfe,
                                      CONCAT15(in_stack_fffffffffffffdfd,
                                               CONCAT14(in_stack_fffffffffffffdfc,
                                                        in_stack_fffffffffffffdf8)))));
    local_68 = std::vector<FDInfo,_std::allocator<FDInfo>_>::end
                         ((vector<FDInfo,_std::allocator<FDInfo>_> *)
                          CONCAT17(in_stack_fffffffffffffdff,
                                   CONCAT16(in_stack_fffffffffffffdfe,
                                            CONCAT15(in_stack_fffffffffffffdfd,
                                                     CONCAT14(in_stack_fffffffffffffdfc,
                                                              in_stack_fffffffffffffdf8)))));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>
                               *)in_stack_fffffffffffffe00,
                              (__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>
                               *)CONCAT17(in_stack_fffffffffffffdff,
                                          CONCAT16(in_stack_fffffffffffffdfe,
                                                   CONCAT15(in_stack_fffffffffffffdfd,
                                                            CONCAT14(in_stack_fffffffffffffdfc,
                                                                     in_stack_fffffffffffffdf8))))),
          bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>::
                 operator*(&local_60);
      ImGui::TableNextRow((ImGuiTableRowFlags)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                          SUB84(in_stack_fffffffffffffe00,0));
      for (local_78 = 0; local_78 < 0x27; local_78 = local_78 + 1) {
        if (((local_78 != 0xe) && (local_78 != 0x26)) &&
           (bVar1 = ImGui::TableSetColumnIndex((int)in_stack_fffffffffffffe00), bVar1)) {
          std::array<ACTColDefTy,_39UL>::operator[]
                    ((array<ACTColDefTy,_39UL> *)in_stack_fffffffffffffe00,
                     CONCAT17(in_stack_fffffffffffffdff,
                              CONCAT16(in_stack_fffffffffffffdfe,
                                       CONCAT15(in_stack_fffffffffffffdfd,
                                                CONCAT14(in_stack_fffffffffffffdfc,
                                                         in_stack_fffffffffffffdf8)))));
          std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
          ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                        *)in_stack_fffffffffffffe00,
                       CONCAT17(in_stack_fffffffffffffdff,
                                CONCAT16(in_stack_fffffffffffffdfe,
                                         CONCAT15(in_stack_fffffffffffffdfd,
                                                  CONCAT14(in_stack_fffffffffffffdfc,
                                                           in_stack_fffffffffffffdf8)))));
          ImGui::TextAligned((AlignTy)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                             (string *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18)
                            );
        }
      }
      LTFlightData::FDKeyTy::c_str((FDKeyTy *)0x12712c);
      ImGui::PushID((char *)in_stack_fffffffffffffe10);
      local_7c = ImGui::GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                    SUB84(in_stack_fffffffffffffe10,0));
      ImGui::GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                         SUB84(in_stack_fffffffffffffe10,0));
      ImGui::PushStyleColor
                (CONCAT13(in_stack_fffffffffffffe37,
                          CONCAT12(in_stack_fffffffffffffe36,in_stack_fffffffffffffe34)),
                 in_stack_fffffffffffffe30);
      ImGui::PushStyleColor
                (CONCAT13(in_stack_fffffffffffffe37,
                          CONCAT12(in_stack_fffffffffffffe36,in_stack_fffffffffffffe34)),
                 in_stack_fffffffffffffe30);
      _x_00 = ImGui::GetWidthIconBtn(SUB81((ulong)in_stack_fffffffffffffe00 >> 0x18,0));
      ImVec2::ImVec2(&local_84,_x_00,0.0);
      local_90 = FDInfo::GetFD(in_stack_fffffffffffffe10);
      if (local_90 == (LTFlightData *)0x0) {
        local_1b8 = (LTAircraft *)0x0;
      }
      else {
        local_1b8 = LTFlightData::GetAircraft(local_90);
      }
      local_98 = local_1b8;
      bVar1 = ImGui::TableSetColumnIndex((int)in_stack_fffffffffffffe00);
      if (bVar1) {
        bVar1 = ImGui::SelectableTooltip
                          ((char *)in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,
                           (bool)in_stack_fffffffffffffe0e,(char *)in_stack_fffffffffffffe00,
                           CONCAT13(in_stack_fffffffffffffdff,
                                    CONCAT12(in_stack_fffffffffffffdfe,
                                             CONCAT11(in_stack_fffffffffffffdfd,
                                                      in_stack_fffffffffffffdfc))),
                           (ImVec2 *)0x127227);
        if (bVar1) {
          in_stack_fffffffffffffe40 = (ACTable *)local_b9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                      )));
          LTFlightData::FDKeyTy::operator_cast_to_string
                    ((FDKeyTy *)
                     CONCAT17(in_stack_fffffffffffffdff,
                              CONCAT16(in_stack_fffffffffffffdfe,
                                       CONCAT15(in_stack_fffffffffffffdfd,
                                                CONCAT14(in_stack_fffffffffffffdfc,
                                                         in_stack_fffffffffffffdf8)))));
          LTOpenURL(in_stack_00000010,in_stack_00000008);
          std::__cxx11::string::~string(local_f0);
          std::__cxx11::string::~string((string *)(local_b9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_b9);
        }
        ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                        SUB84(in_stack_fffffffffffffe00,0));
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
        ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                      *)in_stack_fffffffffffffe00,
                     CONCAT17(in_stack_fffffffffffffdff,
                              CONCAT16(in_stack_fffffffffffffdfe,
                                       CONCAT15(in_stack_fffffffffffffdfd,
                                                CONCAT14(in_stack_fffffffffffffdfc,
                                                         in_stack_fffffffffffffdf8)))));
        std::__cxx11::string::empty();
        bVar1 = ImGui::SelectableTooltip
                          ((char *)in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,
                           (bool)in_stack_fffffffffffffe0e,(char *)in_stack_fffffffffffffe00,
                           CONCAT13(in_stack_fffffffffffffdff,
                                    CONCAT12(in_stack_fffffffffffffdfe,
                                             CONCAT11(in_stack_fffffffffffffdfd,
                                                      in_stack_fffffffffffffdfc))),
                           (ImVec2 *)0x127379);
        if (bVar1) {
          in_stack_fffffffffffffe38 = &local_111;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                      )));
          std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
          ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                        *)in_stack_fffffffffffffe00,
                       CONCAT17(in_stack_fffffffffffffdff,
                                CONCAT16(in_stack_fffffffffffffdfe,
                                         CONCAT15(in_stack_fffffffffffffdfd,
                                                  CONCAT14(in_stack_fffffffffffffdfc,
                                                           in_stack_fffffffffffffdf8)))));
          LTOpenURL(in_stack_00000010,in_stack_00000008);
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator(&local_111);
        }
      }
      bVar1 = ImGui::TableSetColumnIndex((int)in_stack_fffffffffffffe00);
      if (bVar1) {
        if (local_98 == (LTAircraft *)0x0) {
          in_stack_fffffffffffffe37 = false;
        }
        else {
          in_stack_fffffffffffffe37 = XPMP2::Aircraft::IsVisible(&local_98->super_Aircraft);
        }
        local_112 = in_stack_fffffffffffffe37;
        if (local_98 == (LTAircraft *)0x0) {
          in_stack_fffffffffffffe36 = false;
        }
        else {
          in_stack_fffffffffffffe36 = LTAircraft::IsAutoVisible(local_98);
        }
        local_113 = in_stack_fffffffffffffe36;
        local_120 = ACIWnd::GetWnd((FDKeyTy *)
                                   CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        bVar1 = ImGui::SelectableTooltip
                          ((char *)in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,
                           (bool)in_stack_fffffffffffffe0e,(char *)in_stack_fffffffffffffe00,
                           CONCAT13(in_stack_fffffffffffffdff,
                                    CONCAT12(in_stack_fffffffffffffdfe,
                                             CONCAT11(in_stack_fffffffffffffdfd,
                                                      in_stack_fffffffffffffdfc))),
                           (ImVec2 *)0x127501);
        if (bVar1) {
          local_148._32_8_ = ImGui::GetCurrentContext();
          if (local_120 == (ACIWnd *)0x0) {
            in_stack_fffffffffffffe20 = local_148;
            LTFlightData::FDKeyTy::operator_cast_to_string
                      ((FDKeyTy *)
                       CONCAT17(in_stack_fffffffffffffdff,
                                CONCAT16(in_stack_fffffffffffffdfe,
                                         CONCAT15(in_stack_fffffffffffffdfd,
                                                  CONCAT14(in_stack_fffffffffffffdfc,
                                                           in_stack_fffffffffffffdf8)))));
            ACIWnd::OpenNewWnd((string *)in_stack_fffffffffffffe10,
                               CONCAT13(in_stack_fffffffffffffe0f,
                                        CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c
                                                )));
            std::__cxx11::string::~string(local_148);
          }
          else {
            if (local_120 != (ACIWnd *)0x0) {
              (*(local_120->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])();
            }
            local_120 = (ACIWnd *)0x0;
          }
          ImGui::SetCurrentContext((ImGuiContext *)local_148._32_8_);
        }
        ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                        SUB84(in_stack_fffffffffffffe00,0));
        if (local_98 == (LTAircraft *)0x0) {
          in_stack_fffffffffffffe1f = false;
        }
        else {
          in_stack_fffffffffffffe1f = LTAircraft::IsInCameraView(local_98);
        }
        bVar1 = ImGui::SelectableTooltip
                          ((char *)in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,
                           (bool)in_stack_fffffffffffffe0e,(char *)in_stack_fffffffffffffe00,
                           CONCAT13(in_stack_fffffffffffffdff,
                                    CONCAT12(in_stack_fffffffffffffdfe,
                                             CONCAT11(in_stack_fffffffffffffdfd,
                                                      in_stack_fffffffffffffdfc))),
                           (ImVec2 *)0x12762b);
        if (bVar1) {
          LTAircraft::ToggleCameraView((LTAircraft *)in_stack_fffffffffffffe00);
        }
        ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                        SUB84(in_stack_fffffffffffffe00,0));
        local_16a = 0;
        if (local_90 == (LTFlightData *)0x0) {
          in_stack_fffffffffffffe10 = (FDInfo *)local_169;
          std::allocator<char>::allocator();
          local_16a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                      )));
        }
        else {
          pFVar3 = LTFlightData::GetUnsafeStat(local_90);
          std::__cxx11::string::string((string *)(local_169 + 1),(string *)&pFVar3->slug);
        }
        if ((local_16a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)local_169);
        }
        std::__cxx11::string::empty();
        in_stack_fffffffffffffe0f =
             ImGui::SelectableTooltip
                       ((char *)in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,
                        (bool)in_stack_fffffffffffffe0e,(char *)in_stack_fffffffffffffe00,
                        CONCAT13(in_stack_fffffffffffffdff,
                                 CONCAT12(in_stack_fffffffffffffdfe,
                                          CONCAT11(in_stack_fffffffffffffdfd,
                                                   in_stack_fffffffffffffdfc))),(ImVec2 *)0x12770d);
        if ((bool)in_stack_fffffffffffffe0f) {
          in_stack_fffffffffffffe00 = (DataRefs *)local_191;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                      )));
          LTOpenURL(in_stack_00000010,in_stack_00000008);
          std::__cxx11::string::~string((string *)(local_191 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_191);
        }
        ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                        SUB84(in_stack_fffffffffffffe00,0));
        in_stack_fffffffffffffdff =
             ImGui::SelectableTooltip
                       ((char *)in_stack_fffffffffffffe20,
                        (bool *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                        SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0),
                        (char *)CONCAT17(in_stack_fffffffffffffe0f,
                                         CONCAT16(in_stack_fffffffffffffe0e,
                                                  CONCAT24(in_stack_fffffffffffffe0c,
                                                           in_stack_fffffffffffffe08))),
                        (ImGuiSelectableFlags)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                        (ImVec2 *)
                        CONCAT17(in_stack_fffffffffffffdff,
                                 CONCAT16(in_stack_fffffffffffffdfe,
                                          CONCAT15(in_stack_fffffffffffffdfd,
                                                   CONCAT14(in_stack_fffffffffffffdfc,
                                                            in_stack_fffffffffffffdf8)))));
        if ((bool)in_stack_fffffffffffffdff) {
          (*(local_98->super_Aircraft)._vptr_Aircraft[4])(local_98,(ulong)(local_112 & 1));
        }
        in_stack_fffffffffffffdfe = DataRefs::IsAutoHidingActive(in_stack_fffffffffffffe00);
        if ((bool)in_stack_fffffffffffffdfe) {
          ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                          SUB84(in_stack_fffffffffffffe00,0));
          in_stack_fffffffffffffdfd =
               ImGui::SelectableTooltip
                         ((char *)in_stack_fffffffffffffe20,
                          (bool *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                          SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0),
                          (char *)CONCAT17(in_stack_fffffffffffffe0f,
                                           CONCAT16(in_stack_fffffffffffffe0e,
                                                    CONCAT24(in_stack_fffffffffffffe0c,
                                                             in_stack_fffffffffffffe08))),
                          (ImGuiSelectableFlags)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                          (ImVec2 *)
                          CONCAT17(in_stack_fffffffffffffdff,
                                   CONCAT16(in_stack_fffffffffffffdfe,
                                            CONCAT15(in_stack_fffffffffffffdfd,
                                                     CONCAT14(in_stack_fffffffffffffdfc,
                                                              in_stack_fffffffffffffdf8)))));
          if ((bool)in_stack_fffffffffffffdfd) {
            LTAircraft::SetAutoVisible
                      ((LTAircraft *)in_stack_fffffffffffffe00,(bool)in_stack_fffffffffffffdff);
          }
        }
        std::__cxx11::string::~string((string *)(local_169 + 1));
      }
      ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
      ImGui::PopID();
      __gnu_cxx::__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>::
      operator++(&local_60);
    }
    ImGui::EndTable();
  }
  return local_20;
}

Assistant:

LTFlightData* ACTable::build (const std::string& _filter, int _x, int _y)
{
    // return value: the just selected aircraft, if any
    LTFlightData* pSelFD = nullptr;
    
    // Determine size, basis is the available content region
    ImVec2 tblSize = ImGui::GetContentRegionAvail();
    if (_x <= 0) tblSize.x += float(_x);    // Determine width
    else tblSize.x = float(_x);
    if (_y <= 0) tblSize.y += float(_y);    // Determine height
    else tblSize.y = float(_y);
    
    // Start drawing the table
    if (ImGui::BeginTable("ACList", ACT_COL_COUNT,
                          ImGuiTableFlags_Resizable | ImGuiTableFlags_Reorderable |
                          ImGuiTableFlags_Hideable | ImGuiTableFlags_Sortable |
                          ImGuiTableFlags_RowBg |
                          ImGuiTableFlags_SizingPolicyFixedX | ImGuiTableFlags_Scroll |
                          ImGuiTableFlags_ScrollFreezeTopRow |
                          ImGuiTableFlags_ScrollFreezeLeftColumn,
                          tblSize))
    {
        // Set up the columns
        for (ImGuiID col = 0; col < ACT_COL_COUNT; ++col) {
            const ACTColDefTy& colDef = gCols[col];
            ImGui::TableSetupColumn(colDef.colName.c_str(),
                                    colDef.colFlags | ImGuiTableColumnFlags_NoHeaderWidth,
                                    colDef.colWidth,
                                    col);       // use ACTColumnsTy as ColumnUserID
        }
        ImGui::TableAutoHeaders();

        // Set up a/c list
        bool bUpdated = UpdateFDIs(_filter);

        // Sort the data if and as needed
        const ImGuiTableSortSpecs* sortSpecs = ImGui::TableGetSortSpecs();
        if (bUpdated ||
            (sortSpecs && sortSpecs->SpecsChanged &&
             sortSpecs->Specs && sortSpecs->SpecsCount >= 1 &&
             vecFDI.size() > 1))
        {
            // We sort only by one column, no multi-column sort yet
            const ImGuiTableSortSpecsColumn& colSpec = *(sortSpecs->Specs);
            Sort((ACTColumnsTy)colSpec.ColumnUserID,
                 colSpec.SortDirection == ImGuiSortDirection_Ascending);
        }
        
        // Fill the data into the list
        for (const FDInfo& fdi: vecFDI) {
            ImGui::TableNextRow();
            for (size_t col = 0; col < ACT_COL_COUNT; ++col) {
                switch (col) {
                    // There are a few columns with special treatment,
                    case ACT_COL_UPDATE:
                    case ACT_COL_ACTIONS:
                        continue;
                     // the others are just to be drawn
                    default:
                        if (ImGui::TableSetColumnIndex(int(col))) {
                            ImGui::TextAligned(gCols[col].colAlign, fdi.v[col]);
                        }
                }
            }
            
            // --- prepare for columns with action buttons ---
            
            // Make sure all the buttons have a unique id
            ImGui::PushID(fdi.key.c_str());
            
            // Make selected buttons more visible: Exchange Hovered (lighter) and std color (darker)
            const ImU32 colHeader = ImGui::GetColorU32(ImGuiCol_Header);
            ImGui::PushStyleColor(ImGuiCol_Header,          ImGui::GetColorU32(ImGuiCol_HeaderHovered));
            ImGui::PushStyleColor(ImGuiCol_HeaderHovered,   colHeader);
            
            // Limit the width of the selectables
            ImVec2 selSize (ImGui::GetWidthIconBtn(), 0.0f);
            
            // (Potential) access to the aircraft, can be `nullptr`!
            LTFlightData* pFD = fdi.GetFD();
            LTAircraft* pAc = pFD ? pFD->GetAircraft() : nullptr;
            
            // Update columnd
            if (ImGui::TableSetColumnIndex(ACT_COL_UPDATE)) {
                // Aircraft Profile update (if there is an ICAO key)
                if (ImGui::SelectableTooltip(ICON_FA_PLANE "##AircraftProfile",
                                             false,                                         // selected?
                                             fdi.key.eKeyType == LTFlightData::KEY_ICAO,    // enabled?
                                             "Update aircraft profile at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_AC, fdi.key);
                
                // Route update (if there is a call sign)
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_ROUTE "##Route",
                                             false,                                         // selected?
                                             !fdi.v[ACT_COL_CALLSIGN].empty(),              // enabled?
                                             "Update flight/route at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_ROUTE, fdi.v[ACT_COL_CALLSIGN]);
            }

            // Action column
            if (ImGui::TableSetColumnIndex(ACT_COL_ACTIONS)) {
                // Is a/c visible/auto-visible?
                bool bVisible       = pAc ? pAc->IsVisible()        : false;
                bool bAutoVisible   = pAc ? pAc->IsAutoVisible()    : false;

                // Open a/c info window
                ACIWnd* pACIWnd = ACIWnd::GetWnd(fdi.key);
                if (ImGui::SelectableTooltip(ICON_FA_INFO_CIRCLE "##ACIWnd",
                                             pACIWnd != nullptr, true,              // selected?, enabled!
                                             "Open Aircraft Info Window",
                                             ImGuiSelectableFlags_None, selSize))
                {
                    // Toggle a/c info wnd (safe/restore our context as we are now dealing with another ImGui window,
                    // which can mess up context pointers)
                    ImGuiContext* pCtxt = ImGui::GetCurrentContext();
                    if (pACIWnd) {
                        delete pACIWnd;
                        pACIWnd = nullptr;
                    } else {
                        ACIWnd::OpenNewWnd(fdi.key);
                    }
                    ImGui::SetCurrentContext(pCtxt);

                    // Open an ACIWnd, which is another ImGui window, so safe/restore our context
                }

                // Camera view
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_CAMERA "##CameraView",
                                             pAc ? pAc->IsInCameraView() : false,   // selected?
                                             pAc != nullptr,                        // enabled?
                                             "Toggle camera view",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->ToggleCameraView();

                // Link to browser for following the flight
                ImGui::SameLine();
                const std::string url (pFD ? pFD->GetUnsafeStat().slug : "");
                if (ImGui::SelectableTooltip(ICON_FA_EXTERNAL_LINK_SQUARE_ALT "##FlightURL",
                                             false,                                 // selected?
                                             !url.empty(),                          // enabled?
                                             "Open flight in browser",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(url);
                
                // Visible
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_EYE "##Visible", &bVisible,
                                             pAc != nullptr,      // enabled/disabled?
                                             "Toggle aircraft's visibility",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->SetVisible(bVisible);

                // "Auto Visible" only if some auto-hiding option is on
                if (dataRefs.IsAutoHidingActive()) {
                    ImGui::SameLine();
                    if (ImGui::SelectableTooltip(ICON_FA_EYE "##AutoVisible", &bAutoVisible,
                                                 pAc != nullptr,  // enabled/disabled
                                                 "Toggle aircraft's auto visibility",
                                                 ImGuiSelectableFlags_None, selSize))
                        pAc->SetAutoVisible(bAutoVisible);
                }
            } // action column

            // Restore styles
            ImGui::PopStyleColor(2);
            ImGui::PopID();

        }   // for all a/c rows
        
        // End of aircraft list
        ImGui::EndTable();
    }
    
    // return value: the just selected aircraft, if any
    return pSelFD;
}